

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::FixedSchema::FixedSchema(FixedSchema *this,int size,string *name)

{
  Name *this_00;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Schema *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff98;
  Name *in_stack_ffffffffffffffa0;
  
  operator_new(0x60);
  NodeFixed::NodeFixed((NodeFixed *)in_stack_ffffffffffffff80);
  Schema::Schema(in_stack_ffffffffffffff80,
                 (Node *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  *in_RDI = &PTR__FixedSchema_002364d8;
  boost::shared_ptr<avro::Node>::operator->((shared_ptr<avro::Node> *)(in_RDI + 1));
  Node::setFixedSize((Node *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  this_00 = (Name *)boost::shared_ptr<avro::Node>::operator->
                              ((shared_ptr<avro::Node> *)(in_RDI + 1));
  Name::Name(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Node::setName((Node *)this_00,
                (Name *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  Name::~Name(this_00);
  return;
}

Assistant:

FixedSchema::FixedSchema(int size, const std::string &name) :
    Schema(new NodeFixed)
{
    node_->setFixedSize(size);
    node_->setName(name);
}